

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoel.cpp
# Opt level: O0

void __thiscall TPZGeoEl::GetHigherSubElements(TPZGeoEl *this,TPZVec<TPZGeoEl_*> *unrefinedSons)

{
  int iVar1;
  int64_t iVar2;
  TPZVec<TPZGeoEl_*> *in_RSI;
  long *in_RDI;
  int oldSize;
  TPZGeoEl *son;
  int s;
  int nsons;
  long *local_20;
  int local_18;
  int local_14;
  TPZVec<TPZGeoEl_*> *local_10;
  
  local_10 = in_RSI;
  local_14 = (**(code **)(*in_RDI + 0x148))();
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_20 = (long *)(**(code **)(*in_RDI + 0x1f8))(in_RDI,local_18);
    if (local_20 != (long *)0x0) {
      iVar1 = (**(code **)(*local_20 + 0x1d0))();
      if (iVar1 == 0) {
        iVar2 = TPZVec<TPZGeoEl_*>::NElements(local_10);
        (*local_10->_vptr_TPZVec[2])(local_10,(long)((int)iVar2 + 1),&local_20);
      }
      else {
        (**(code **)(*local_20 + 0xb0))(local_20,local_10);
      }
    }
  }
  return;
}

Assistant:

void TPZGeoEl::GetHigherSubElements(TPZVec<TPZGeoEl*> &unrefinedSons)
{
    int nsons = this->NSubElements();
    for(int s = 0; s < nsons; s++)
    {
        TPZGeoEl * son = this->SubElement(s);
        if(!son) continue;
    
        if(son->HasSubElement() == false)
        {
            int oldSize = unrefinedSons.NElements();
            unrefinedSons.Resize(oldSize+1, son);
        }
        else
        {
            son->GetHigherSubElements(unrefinedSons);
        }
    }
}